

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmstrcmp.cpp
# Opt level: O0

int __thiscall
CVmObjStrComp::getp_calc_hash(CVmObjStrComp *this,vm_obj_id_t param_2,vm_val_t *retval,uint *argc)

{
  int iVar1;
  int32_t intval;
  char *pcVar2;
  size_t sVar3;
  vm_val_t *in_RDX;
  vm_val_t *in_RDI;
  char *strp;
  vm_val_t *in_stack_ffffffffffffffa8;
  uint *in_stack_ffffffffffffffb0;
  
  if ((getp_calc_hash(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') &&
     (iVar1 = __cxa_guard_acquire(&getp_calc_hash(unsigned_int,vm_val_t*,unsigned_int*)::desc),
     iVar1 != 0)) {
    CVmNativeCodeDesc::CVmNativeCodeDesc(&getp_calc_hash::desc,1);
    __cxa_guard_release(&getp_calc_hash(unsigned_int,vm_val_t*,unsigned_int*)::desc);
  }
  iVar1 = CVmObject::get_prop_check_argc
                    (in_RDI,in_stack_ffffffffffffffb0,(CVmNativeCodeDesc *)in_stack_ffffffffffffffa8
                    );
  if (iVar1 == 0) {
    CVmStack::get(0);
    pcVar2 = vm_val_t::get_as_string(in_stack_ffffffffffffffa8);
    if (pcVar2 == (char *)0x0) {
      err_throw(0);
    }
    pcVar2 = pcVar2 + 2;
    sVar3 = vmb_get_len((char *)0x337d8a);
    intval = (**(code **)(*(long *)in_RDI + 0x1d8))(in_RDI,pcVar2,sVar3);
    vm_val_t::set_int(in_RDX,intval);
    CVmStack::discard();
  }
  return 1;
}

Assistant:

int CVmObjStrComp::getp_calc_hash(VMG_ vm_obj_id_t /*self*/,
                                  vm_val_t *retval, uint *argc)
{
    static CVmNativeCodeDesc desc(1);
    const char *strp;

    /* check arguments */
    if (get_prop_check_argc(retval, argc, &desc))
        return TRUE;

    /* 
     *   retrieve the string argument (it must be a string), but leave it on
     *   the stack for now, for gc protection 
     */
    strp = G_stk->get(0)->get_as_string(vmg0_);
    if (strp == 0)
        err_throw(VMERR_BAD_TYPE_BIF);

    /* calculate the hash value and return it */
    retval->set_int(calc_str_hash(strp + VMB_LEN, vmb_get_len(strp)));

    /* discard gc protection */
    G_stk->discard();

    /* handled */
    return TRUE;
}